

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall embree::XMLWriter::store(XMLWriter *this,DistantLight *light,ssize_t id)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  vfloat4 a;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  string asStack_98 [32];
  string local_78 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  std::__cxx11::string::string(local_78,"DistantLight",(allocator *)&local_58.field_1);
  open(this,(char *)local_78,(int)id);
  std::__cxx11::string::~string(local_78);
  fVar4 = (light->D).field_0.m128[0];
  fVar5 = (light->D).field_0.m128[2];
  fVar3 = -(light->D).field_0.m128[1];
  fVar8 = -fVar5;
  auVar6._8_4_ = 0xffffffff;
  auVar6._0_8_ = 0xffffffffffffffff;
  if (fVar3 * fVar3 + fVar5 * fVar5 + 0.0 <= fVar4 * fVar4 + fVar8 * fVar8 + 0.0) {
    auVar6 = SUB1612((undefined1  [16])0x0,0);
  }
  auVar7._0_4_ = ~auVar6._0_4_ & (uint)fVar8;
  auVar7._4_4_ = 0;
  auVar7._8_4_ = ~auVar6._8_4_ & (uint)fVar4;
  auVar2._4_4_ = (uint)fVar3 & auVar6._8_4_;
  auVar2._0_4_ = (uint)fVar5 & auVar6._4_4_;
  auVar2._8_4_ = 0;
  auVar7 = auVar7 | auVar2 << 0x20;
  fVar3 = auVar7._0_4_;
  fVar8 = auVar7._4_4_;
  fVar14 = auVar7._8_4_;
  fVar4 = fVar8 * fVar8;
  fVar5 = fVar14 * fVar14;
  fVar10 = fVar4 + fVar3 * fVar3 + fVar5;
  fVar11 = fVar4 + fVar4 + 0.0;
  fVar5 = fVar4 + fVar5 + fVar5;
  fVar4 = fVar4 + 0.0 + 0.0;
  auVar12._4_4_ = fVar11;
  auVar12._0_4_ = fVar10;
  auVar12._8_4_ = fVar5;
  auVar12._12_4_ = fVar4;
  auVar13._4_4_ = fVar11;
  auVar13._0_4_ = fVar10;
  auVar13._8_4_ = fVar5;
  auVar13._12_4_ = fVar4;
  auVar13 = rsqrtss(auVar12,auVar13);
  fVar4 = auVar13._0_4_;
  fVar4 = fVar4 * 1.5 - fVar4 * fVar4 * fVar10 * 0.5 * fVar4;
  local_58.m128[0] = fVar4 * fVar3;
  local_58.m128[1] = fVar4 * fVar8;
  local_58.m128[2] = fVar4 * fVar14;
  local_58.m128[3] = fVar4 * 0.0;
  local_38 = (light->D).field_0.m128[0];
  fStack_34 = (light->D).field_0.m128[1];
  fStack_30 = (light->D).field_0.m128[2];
  fStack_2c = (light->D).field_0.m128[3];
  fStack_40 = local_58.m128[1] * local_38 - fStack_34 * local_58.m128[0];
  local_48 = local_58.m128[2] * fStack_34 - fStack_30 * local_58.m128[1];
  fStack_44 = local_58.m128[0] * fStack_30 - local_38 * local_58.m128[2];
  fVar3 = local_58.m128[3] * fStack_2c - fStack_2c * local_58.m128[3];
  fVar4 = local_48 * local_48;
  fVar5 = fStack_44 * fStack_44;
  fVar8 = fVar3 * fVar3;
  fVar14 = fVar5 + fVar4 + fStack_40 * fStack_40;
  fVar10 = fVar8 + fVar4 + fVar4;
  fVar5 = fVar5 + fVar4 + fVar5;
  fVar8 = fVar8 + fVar4 + fVar8;
  auVar9._4_4_ = fVar10;
  auVar9._0_4_ = fVar14;
  auVar9._8_4_ = fVar5;
  auVar9._12_4_ = fVar8;
  auVar1._4_4_ = fVar10;
  auVar1._0_4_ = fVar14;
  auVar1._8_4_ = fVar5;
  auVar1._12_4_ = fVar8;
  auVar13 = rsqrtss(auVar9,auVar1);
  fVar4 = auVar13._0_4_;
  fStack_3c = fVar4 * 1.5 - fVar4 * fVar4 * fVar14 * 0.5 * fVar4;
  local_48 = fStack_3c * local_48;
  fStack_44 = fStack_3c * fStack_44;
  fStack_40 = fStack_3c * fStack_40;
  fStack_3c = fStack_3c * fVar3;
  local_28 = 0;
  uStack_20 = 0;
  store(this,"AffineSpace",(AffineSpace3fa *)&local_58.field_1);
  store(this,"L",&light->L);
  store(this,"halfAngle",&light->halfAngle);
  std::__cxx11::string::string(asStack_98,"DistantLight",(allocator *)&local_58.field_1);
  close(this,(int)asStack_98);
  std::__cxx11::string::~string(asStack_98);
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::DistantLight& light, ssize_t id)
  {
    open("DistantLight",id);
    store("AffineSpace",frame(light.D));
    store("L",light.L);
    store("halfAngle",light.halfAngle);
    close("DistantLight");
  }